

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> * __thiscall
ear::Layout::nominalPositions
          (vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *__return_storage_ptr__,
          Layout *this)

{
  pointer *ppPVar1;
  pointer pCVar2;
  pointer pCVar3;
  iterator __position;
  double dVar4;
  double dVar5;
  long lVar6;
  double *pdVar7;
  storage_type *psVar8;
  bool bVar9;
  bool bVar10;
  long *local_d8 [2];
  long local_c8 [2];
  double local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char local_a0;
  double local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  char local_68;
  type local_60;
  undefined8 uStack_58;
  undefined1 local_50;
  PolarPosition local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar2 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_start;
  pCVar3 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar2 != pCVar3) {
    psVar8 = &(pCVar2->_elevationRange).super_type.m_storage;
    do {
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d8,*(long *)((long)(psVar8 + -8) + 8),
                 *(long *)(psVar8 + -7) + *(long *)((long)(psVar8 + -8) + 8));
      local_a8 = *(undefined8 *)((long)(psVar8 + -5) + 8);
      local_b8 = *(double *)((long)(psVar8 + -6) + 8);
      uStack_b0 = *(undefined8 *)(psVar8 + -5);
      local_a0 = 0;
      bVar9 = *(char *)(psVar8 + -4) == '\x01';
      if (bVar9) {
        local_88 = *(undefined8 *)((long)(psVar8 + -3) + 8);
        local_98 = *(double *)((long)(psVar8 + -4) + 8);
        uStack_90 = *(undefined8 *)(psVar8 + -3);
        local_a0 = 1;
      }
      local_80 = 0;
      bVar10 = *(char *)(psVar8 + -2) == '\x01';
      if (bVar10) {
        local_78 = *(undefined8 *)((long)(psVar8 + -2) + 8);
        uStack_70 = *(undefined8 *)(psVar8 + -1);
        local_80 = 1;
      }
      local_68 = *(char *)((long)(psVar8 + -1) + 8) == '\x01';
      if ((bool)local_68) {
        local_60 = (psVar8->dummy_).aligner_;
        uStack_58 = *(undefined8 *)((long)&psVar8->dummy_ + 8);
      }
      local_50 = *(undefined1 *)(psVar8 + 1);
      pdVar7 = &local_b8;
      if (bVar9) {
        pdVar7 = &local_98;
      }
      local_48.distance = pdVar7[2];
      local_48.azimuth = *pdVar7;
      local_48.elevation = pdVar7[1];
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_a0 = bVar9;
      local_80 = bVar10;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>::
        _M_realloc_insert<ear::PolarPosition>(__return_storage_ptr__,__position,&local_48);
      }
      else {
        dVar4 = *pdVar7;
        dVar5 = pdVar7[1];
        (__position._M_current)->distance = pdVar7[2];
        (__position._M_current)->azimuth = dVar4;
        (__position._M_current)->elevation = dVar5;
        ppPVar1 = &(__return_storage_ptr__->
                   super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      if (local_68 == '\x01') {
        local_68 = '\0';
      }
      if (local_80 == '\x01') {
        local_80 = '\0';
      }
      if (local_a0 == '\x01') {
        local_a0 = '\0';
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      lVar6 = (long)(psVar8 + 1);
      psVar8 = psVar8 + 9;
    } while ((pointer)(lVar6 + 8) != pCVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<PolarPosition> Layout::nominalPositions() const {
    std::vector<PolarPosition> pos;
    std::transform(
        _channels.begin(), _channels.end(), std::back_inserter(pos),
        [](Channel c) -> PolarPosition { return c.polarPositionNominal(); });
    return pos;
  }